

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int send_handshake_done(quicly_conn_t *conn,quicly_send_context_t *s)

{
  uint8_t *puVar1;
  int iVar2;
  quicly_send_context_t *in_RSI;
  quicly_conn_t *in_RDI;
  int ret;
  quicly_sent_t *sent;
  quicly_sent_acked_cb in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  size_t in_stack_ffffffffffffffe8;
  
  iVar2 = allocate_ack_eliciting_frame
                    (in_RDI,in_RSI,in_stack_ffffffffffffffe8,
                     (quicly_sent_t **)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                     ,in_stack_ffffffffffffffd8);
  if (iVar2 == 0) {
    puVar1 = in_RSI->dst;
    in_RSI->dst = puVar1 + 1;
    *puVar1 = '\x1e';
    (in_RDI->egress).pending_flows = (in_RDI->egress).pending_flows & 0xbf;
    (in_RDI->super).stats.num_frames_sent.handshake_done =
         (in_RDI->super).stats.num_frames_sent.handshake_done + 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int send_handshake_done(quicly_conn_t *conn, quicly_send_context_t *s)
{
    quicly_sent_t *sent;
    int ret;

    if ((ret = allocate_ack_eliciting_frame(conn, s, 1, &sent, on_ack_handshake_done)) != 0)
        goto Exit;
    *s->dst++ = QUICLY_FRAME_TYPE_HANDSHAKE_DONE;
    conn->egress.pending_flows &= ~QUICLY_PENDING_FLOW_HANDSHAKE_DONE_BIT;
    ++conn->super.stats.num_frames_sent.handshake_done;
    QUICLY_PROBE(HANDSHAKE_DONE_SEND, conn, conn->stash.now);

    ret = 0;
Exit:
    return ret;
}